

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

OmegaOP * __thiscall
pybind11::detail::
argument_loader<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>,double,std::__cxx11::string,double,std::__cxx11::string>
::
call_impl<OmegaOP*,OmegaOP*(*&)(std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>,double,std::__cxx11::string,double,std::__cxx11::string),0ul,1ul,2ul,3ul,4ul,5ul,pybind11::detail::void_type>
          (argument_loader<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>,double,std::__cxx11::string,double,std::__cxx11::string>
           *this,undefined8 *f)

{
  argument_loader<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>,double,std::__cxx11::string,double,std::__cxx11::string>
  *paVar1;
  code *pcVar2;
  OmegaOP *pOVar3;
  argument_loader<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>,double,std::__cxx11::string,double,std::__cxx11::string>
  *local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  void *local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  void *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  argument_loader<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>,double,std::__cxx11::string,double,std::__cxx11::string>
  *local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  pcVar2 = (code *)*f;
  local_58 = *(void **)(this + 0x68);
  uStack_50 = *(undefined8 *)(this + 0x70);
  local_48 = *(undefined8 *)(this + 0x78);
  *(undefined8 *)(this + 0x78) = 0;
  *(undefined8 *)(this + 0x68) = 0;
  *(undefined8 *)(this + 0x70) = 0;
  local_78 = *(void **)(this + 0x50);
  uStack_70 = *(undefined8 *)(this + 0x58);
  local_68 = *(undefined8 *)(this + 0x60);
  *(undefined8 *)(this + 0x60) = 0;
  *(undefined8 *)(this + 0x50) = 0;
  *(undefined8 *)(this + 0x58) = 0;
  paVar1 = this + 0x38;
  if (*(argument_loader<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>,double,std::__cxx11::string,double,std::__cxx11::string>
        **)(this + 0x28) == paVar1) {
    local_88 = *(undefined8 *)paVar1;
    uStack_80 = *(undefined8 *)(this + 0x40);
    local_98 = (argument_loader<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>,double,std::__cxx11::string,double,std::__cxx11::string>
                *)&local_88;
  }
  else {
    local_88 = *(undefined8 *)paVar1;
    local_98 = *(argument_loader<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>,double,std::__cxx11::string,double,std::__cxx11::string>
                 **)(this + 0x28);
  }
  local_90 = *(undefined8 *)(this + 0x30);
  *(argument_loader<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>,double,std::__cxx11::string,double,std::__cxx11::string>
    **)(this + 0x28) = paVar1;
  *(undefined8 *)(this + 0x30) = 0;
  this[0x38] = (argument_loader<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>,double,std::__cxx11::string,double,std::__cxx11::string>
                )0x0;
  paVar1 = this + 0x10;
  if (*(argument_loader<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>,double,std::__cxx11::string,double,std::__cxx11::string>
        **)this == paVar1) {
    local_28 = *(undefined8 *)paVar1;
    uStack_20 = *(undefined4 *)(this + 0x18);
    uStack_1c = *(undefined4 *)(this + 0x1c);
    local_38 = (argument_loader<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>,double,std::__cxx11::string,double,std::__cxx11::string>
                *)&local_28;
  }
  else {
    local_28 = *(undefined8 *)paVar1;
    local_38 = *(argument_loader<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>,double,std::__cxx11::string,double,std::__cxx11::string>
                 **)this;
  }
  local_30 = *(undefined8 *)(this + 8);
  *(argument_loader<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>,double,std::__cxx11::string,double,std::__cxx11::string>
    **)this = paVar1;
  *(undefined8 *)(this + 8) = 0;
  this[0x10] = (argument_loader<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>,double,std::__cxx11::string,double,std::__cxx11::string>
                )0x0;
  pOVar3 = (OmegaOP *)
           (*pcVar2)((int)*(undefined8 *)(this + 0x48),(int)*(undefined8 *)(this + 0x20),&local_58,
                     &local_78,&local_98);
  if (local_38 !=
      (argument_loader<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>,double,std::__cxx11::string,double,std::__cxx11::string>
       *)&local_28) {
    operator_delete(local_38);
  }
  if (local_98 !=
      (argument_loader<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>,double,std::__cxx11::string,double,std::__cxx11::string>
       *)&local_88) {
    operator_delete(local_98);
  }
  if (local_78 != (void *)0x0) {
    operator_delete(local_78);
  }
  if (local_58 != (void *)0x0) {
    operator_delete(local_58);
  }
  return pOVar3;
}

Assistant:

Return call_impl(Func &&f, index_sequence<Is...>, Guard &&) {
        return std::forward<Func>(f)(cast_op<Args>(std::move(std::get<Is>(argcasters)))...);
    }